

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::AddP70vectorA(Node *this,string *name,double x,double y,double z)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  Node n;
  double z_local;
  double y_local;
  double x_local;
  string *name_local;
  Node *this_local;
  
  n.property_start = (size_t)z;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"P",&local_c1);
  Node((Node *)local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::string((string *)&local_f8,(string *)name);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,double,double,double>
            ((Node *)local_a0,&local_f8,"Vector","","A",x,y,(double)n.property_start);
  std::__cxx11::string::~string((string *)&local_f8);
  AddChild(this,(Node *)local_a0);
  ~Node((Node *)local_a0);
  return;
}

Assistant:

void FBX::Node::AddP70vectorA(
    const std::string& name, double x, double y, double z
) {
    FBX::Node n("P");
    n.AddProperties(name, "Vector", "", "A", x, y, z);
    AddChild(n);
}